

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.c
# Opt level: O2

int pair0_set_send_buf_len(void *arg,void *buf,size_t sz,nni_type t)

{
  _Bool _Var1;
  int iVar2;
  int local_2c [2];
  int val;
  
  iVar2 = nni_copyin_int(local_2c,buf,sz,0,0x2000,t);
  if (iVar2 == 0) {
    nni_mtx_lock((nni_mtx *)((long)arg + 8));
    iVar2 = nni_lmq_resize((nni_lmq *)((long)arg + 0x30),(long)local_2c[0]);
    _Var1 = nni_lmq_full((nni_lmq *)((long)arg + 0x30));
    if (_Var1) {
      if (*(char *)((long)arg + 0x111) == '\0') {
        nni_pollable_clear((nni_pollable *)((long)arg + 0x100));
      }
    }
    else {
      nni_pollable_raise((nni_pollable *)((long)arg + 0x100));
    }
    nni_mtx_unlock((nni_mtx *)((long)arg + 8));
  }
  return iVar2;
}

Assistant:

static int
pair0_set_send_buf_len(void *arg, const void *buf, size_t sz, nni_type t)
{
	pair0_sock *s = arg;
	int         val;
	int         rv;

	if ((rv = nni_copyin_int(&val, buf, sz, 0, 8192, t)) != 0) {
		return (rv);
	}
	nni_mtx_lock(&s->mtx);
	rv = nni_lmq_resize(&s->wmq, (size_t) val);
	// Changing the size of the queue can affect our readiness.
	if (!nni_lmq_full(&s->wmq)) {
		nni_pollable_raise(&s->writable);
	} else if (!s->wr_ready) {
		nni_pollable_clear(&s->writable);
	}
	nni_mtx_unlock(&s->mtx);
	return (rv);
}